

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SCMPrint.cpp
# Opt level: O0

void processElements(XSNamedMap<xercesc_4_0::XSObject> *xsElements)

{
  XSElementDeclaration *pXVar1;
  TYPE_CATEGORY TVar2;
  XMLSize_t XVar3;
  ostream *poVar4;
  XSElementDeclaration *pXVar5;
  XMLCh *toTranscode;
  StrX local_30;
  XSTypeDefinition *local_28;
  XSTypeDefinition *xsTypeDef;
  XSElementDeclaration *xsElement;
  XMLSize_t i;
  XSNamedMap<xercesc_4_0::XSObject> *xsElements_local;
  
  i = (XMLSize_t)xsElements;
  if ((xsElements != (XSNamedMap<xercesc_4_0::XSObject> *)0x0) &&
     (XVar3 = xercesc_4_0::XSNamedMap<xercesc_4_0::XSObject>::getLength(xsElements), XVar3 != 0)) {
    for (xsElement = (XSElementDeclaration *)0x0; pXVar1 = xsElement,
        pXVar5 = (XSElementDeclaration *)
                 xercesc_4_0::XSNamedMap<xercesc_4_0::XSObject>::getLength
                           ((XSNamedMap<xercesc_4_0::XSObject> *)i), pXVar1 < pXVar5;
        xsElement = xsElement + 1) {
      xsTypeDef = (XSTypeDefinition *)
                  xercesc_4_0::XSNamedMap<xercesc_4_0::XSObject>::item
                            ((XSNamedMap<xercesc_4_0::XSObject> *)i,(XMLSize_t)xsElement);
      printBasic((XSObject *)xsTypeDef,"Element");
      local_28 = xercesc_4_0::XSElementDeclaration::getTypeDefinition
                           ((XSElementDeclaration *)xsTypeDef);
      poVar4 = std::operator<<((ostream *)&std::cout,"Content Model");
      std::operator<<(poVar4,"\n");
      std::operator<<((ostream *)&std::cout,"\tType:\t");
      TVar2 = xercesc_4_0::XSTypeDefinition::getTypeCategory(local_28);
      if (TVar2 == SIMPLE_TYPE) {
        std::operator<<((ostream *)&std::cout,"Simple\n");
      }
      else {
        std::operator<<((ostream *)&std::cout,"Complex\n");
      }
      poVar4 = std::operator<<((ostream *)&std::cout,"\tName:\t");
      toTranscode = (XMLCh *)(**(code **)(*(long *)local_28 + 0x10))();
      StrX::StrX(&local_30,toTranscode);
      poVar4 = operator<<(poVar4,&local_30);
      std::operator<<(poVar4,"\n");
      StrX::~StrX(&local_30);
      poVar4 = std::operator<<((ostream *)&std::cout,
                               "\n--------------------------------------------");
      std::ostream::operator<<(poVar4,std::endl<char,std::char_traits<char>>);
    }
    return;
  }
  poVar4 = std::operator<<((ostream *)&std::cout,"no elements\n\n");
  std::ostream::operator<<(poVar4,std::endl<char,std::char_traits<char>>);
  return;
}

Assistant:

void processElements(XSNamedMap<XSObject> *xsElements)
{
    if (!xsElements || xsElements->getLength() == 0) {
        std::cout << "no elements\n\n"  << std::endl;
        return;
    }
    for (XMLSize_t i=0; i < xsElements->getLength(); i++) {
        XSElementDeclaration *xsElement = (XSElementDeclaration *)xsElements->item(i);
        printBasic(xsElement, "Element");

        // Content Model
        XSTypeDefinition *xsTypeDef = xsElement->getTypeDefinition();
        std::cout << "Content Model" << "\n";
        std::cout << "\tType:\t";
        if (xsTypeDef->getTypeCategory() == XSTypeDefinition::SIMPLE_TYPE) {
            std::cout << "Simple\n";
        } else {
            std::cout << "Complex\n";
        }
        std::cout << "\tName:\t"
            << StrX(xsTypeDef->getName()) << "\n";

        std::cout << "\n--------------------------------------------" << std::endl;
    }
}